

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_expr_t * gs_parse_expr_array_decl(gs_parser_t *parser)

{
  gs_token_t token_00;
  vec_gs_expr_t args_00;
  _Bool _Var1;
  int iVar2;
  gs_token_t local_68;
  gs_expr_t *local_50;
  gs_expr_t *arg;
  gs_expr_t *expr;
  vec_gs_expr_t args;
  gs_token_t token;
  gs_parser_t *parser_local;
  
  gs_peek((gs_token_t *)&args.alloc_category,parser);
  memset(&expr,0,0x18);
  args._8_8_ = anon_var_dwarf_24ba4;
  arg = (gs_expr_t *)0x0;
  _Var1 = gs_eat_char(parser,']');
  if (!_Var1) {
    do {
      local_50 = gs_parse_expr(parser);
      if ((parser->error & 1U) != 0) goto LAB_00159db1;
      iVar2 = vec_expand_((char **)&expr,(int *)&args,(int *)((long)&args.data + 4),8,
                          (char *)args._8_8_);
      if (iVar2 == 0) {
        *(gs_expr_t **)(&expr->type + (long)(int)args.data * 2) = local_50;
        args.data._0_4_ = (int)args.data + 1;
      }
      _Var1 = gs_eat_char(parser,',');
    } while (_Var1);
    _Var1 = gs_eat_char(parser,']');
    if (!_Var1) {
      gs_peek(&local_68,parser);
      gs_parser_error(parser,0x309b12);
      goto LAB_00159db1;
    }
  }
  args_00.capacity = args.data._4_4_;
  args_00.length = (int)args.data;
  token_00._8_8_ = token._0_8_;
  token_00._0_8_ = args.alloc_category;
  token_00.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
  args_00.data = (gs_expr_t **)expr;
  args_00.alloc_category = (char *)args._8_8_;
  arg = gs_expr_array_decl_new(parser,token_00,args_00);
LAB_00159db1:
  golf_free_tracked(expr);
  return arg;
}

Assistant:

static gs_expr_t *gs_parse_expr_array_decl(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    vec_gs_expr_t args;
    vec_init(&args, "script/parser");

    gs_expr_t *expr = NULL;

    if (!gs_eat_char(parser, ']')) {
        while (true) {
            gs_expr_t *arg = gs_parse_expr(parser);
            if (parser->error) goto cleanup;

            vec_push(&args, arg);
            if (!gs_eat_char(parser, ',')) {
                if (!gs_eat_char(parser, ']')) {
                    gs_parser_error(parser, gs_peek(parser), "Expected ']' when parsing array declaration");
                    goto cleanup;
                }
                break;
            }
        }
    }

    expr = gs_expr_array_decl_new(parser, token, args);

cleanup:
    vec_deinit(&args);
    return expr;
}